

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pluginmanager.cc
# Opt level: O0

void __thiscall Typelib::PluginManager::registerPluginTypes(PluginManager *this,Registry *registry)

{
  bool bVar1;
  reference ppTVar2;
  __normal_iterator<Typelib::TypeDefinitionPlugin_**,_std::vector<Typelib::TypeDefinitionPlugin_*,_std::allocator<Typelib::TypeDefinitionPlugin_*>_>_>
  local_28;
  __normal_iterator<Typelib::TypeDefinitionPlugin_**,_std::vector<Typelib::TypeDefinitionPlugin_*,_std::allocator<Typelib::TypeDefinitionPlugin_*>_>_>
  local_20;
  iterator it;
  Registry *registry_local;
  PluginManager *this_local;
  
  it._M_current = (TypeDefinitionPlugin **)registry;
  local_20._M_current =
       (TypeDefinitionPlugin **)
       std::
       vector<Typelib::TypeDefinitionPlugin_*,_std::allocator<Typelib::TypeDefinitionPlugin_*>_>::
       begin(&this->m_definition_plugins);
  while( true ) {
    local_28._M_current =
         (TypeDefinitionPlugin **)
         std::
         vector<Typelib::TypeDefinitionPlugin_*,_std::allocator<Typelib::TypeDefinitionPlugin_*>_>::
         end(&this->m_definition_plugins);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<Typelib::TypeDefinitionPlugin_**,_std::vector<Typelib::TypeDefinitionPlugin_*,_std::allocator<Typelib::TypeDefinitionPlugin_*>_>_>
              ::operator*(&local_20);
    (**(code **)(*(long *)*ppTVar2 + 0x10))(*ppTVar2,it._M_current);
    __gnu_cxx::
    __normal_iterator<Typelib::TypeDefinitionPlugin_**,_std::vector<Typelib::TypeDefinitionPlugin_*,_std::allocator<Typelib::TypeDefinitionPlugin_*>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void PluginManager::registerPluginTypes(Registry& registry)
{
    for (vector<TypeDefinitionPlugin*>::iterator it = m_definition_plugins.begin();
            it != m_definition_plugins.end(); ++it)
    {
        (*it)->registerTypes(registry);
    }
}